

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

QPDFObjectHandle __thiscall
QPDFObjectHandle::newDictionary
          (QPDFObjectHandle *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
          *items)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Base_ptr p_Var3;
  size_t *psVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Base_ptr p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  QPDFObjectHandle QVar6;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  _Stack_48;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  ::_Rb_tree(&_Stack_48,&items->_M_t);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002ebaf0;
  p_Var3 = (_Base_ptr)&p_Var2[1]._M_use_count;
  if (_Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    psVar4 = (size_t *)&p_Var2[3]._M_use_count;
    _Stack_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    p_Var5 = p_Var3;
  }
  else {
    p_Var1 = &_Stack_48._M_impl.super__Rb_tree_header;
    p_Var2[2]._vptr__Sp_counted_base =
         (_func_int **)_Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent;
    (_Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var3;
    psVar4 = &_Stack_48._M_impl.super__Rb_tree_header._M_node_count;
    p_Var2[3]._M_use_count = (undefined4)_Stack_48._M_impl.super__Rb_tree_header._M_node_count;
    p_Var2[3]._M_weak_count = _Stack_48._M_impl.super__Rb_tree_header._M_node_count._4_4_;
    _Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    p_Var3 = _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var5 = _Stack_48._M_impl.super__Rb_tree_header._M_header._M_right;
    _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_48._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  *(_Base_ptr *)&p_Var2[2]._M_use_count = p_Var3;
  p_Var2[3]._vptr__Sp_counted_base = (_func_int **)p_Var5;
  *psVar4 = 0;
  p_Var2[1]._M_use_count = _Stack_48._M_impl.super__Rb_tree_header._M_header._M_color;
  *(undefined1 *)&p_Var2[4]._vptr__Sp_counted_base = 9;
  p_Var2[4]._M_use_count = 0;
  p_Var2[4]._M_weak_count = 0;
  p_Var2[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[5]._M_use_count = 0;
  p_Var2[5]._M_weak_count = 0;
  p_Var2[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[6]._M_use_count = -1;
  p_Var2[6]._M_weak_count = -1;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  ::~_Rb_tree(&_Stack_48);
  (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::newDictionary(std::map<std::string, QPDFObjectHandle> const& items)
{
    return {QPDFObject::create<QPDF_Dictionary>(items)};
}